

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Expr * __thiscall parser::Parser::parseBoolean(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  Expr *pEVar3;
  long *plVar4;
  long *plVar5;
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined **local_58;
  int local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  TVar1 = (this->curToken).Type;
  pEVar3 = (Expr *)operator_new(0x48);
  if (TVar1 == TRUE) {
    local_58 = &PTR__Token_001788e0;
    local_50 = 0x102;
    plVar5 = local_38;
    pcVar2 = (this->curToken).Literal._M_dataplus._M_p;
    local_48 = plVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (this->curToken).Literal._M_string_length);
    (pEVar3->super_Node).lineno = this->l->line;
    (pEVar3->super_Node).type_value = BooleanType;
    (pEVar3->super_Node)._vptr_Node = (_func_int **)&PTR__BooleanExpr_00179068;
    pEVar3[1].super_Node._vptr_Node = (_func_int **)&PTR__Token_001788e0;
    pEVar3[1].super_Node.lineno = local_50;
    pEVar3[2].super_Node._vptr_Node = (_func_int **)(pEVar3 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pEVar3 + 2),local_48,local_40 + (long)local_48);
    *(undefined1 *)&pEVar3[4].super_Node._vptr_Node = 1;
    local_58 = &PTR__Token_001788e0;
    plVar4 = local_48;
  }
  else {
    plVar5 = local_68;
    pcVar2 = (this->curToken).Literal._M_dataplus._M_p;
    local_78 = plVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (this->curToken).Literal._M_string_length);
    (pEVar3->super_Node).lineno = this->l->line;
    (pEVar3->super_Node).type_value = BooleanType;
    (pEVar3->super_Node)._vptr_Node = (_func_int **)&PTR__BooleanExpr_00179068;
    pEVar3[1].super_Node._vptr_Node = (_func_int **)&PTR__Token_001788e0;
    pEVar3[1].super_Node.lineno = TVar1;
    pEVar3[2].super_Node._vptr_Node = (_func_int **)(pEVar3 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pEVar3 + 2),local_78,local_70 + (long)local_78);
    *(undefined1 *)&pEVar3[4].super_Node._vptr_Node = 0;
    plVar4 = local_78;
  }
  if (plVar4 != plVar5) {
    operator_delete(plVar4,*plVar5 + 1);
  }
  return pEVar3;
}

Assistant:

Expr* Parser::parseBoolean()
{
    if(curTokenIs(TokenType::TRUE))
        return new BooleanExpr(curToken, true, l->line);
    return new BooleanExpr(curToken, false, l->line);
}